

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramClear(VP8LHistogram *h)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  iVar1 = h->palette_code_bits;
  puVar2 = h->literal;
  iVar3 = (4 << ((byte)iVar1 & 0x1f)) + 0x1150;
  if (iVar1 < 1) {
    iVar3 = 0x1150;
  }
  memset(h,0,(long)iVar3);
  h->palette_code_bits = iVar1;
  h->literal = puVar2;
  HistogramStatsClear(h);
  return;
}

Assistant:

static void HistogramClear(VP8LHistogram* const h) {
  uint32_t* const literal = h->literal;
  const int cache_bits = h->palette_code_bits;
  const int histo_size = GetHistogramSize(cache_bits);
  memset(h, 0, histo_size);
  h->palette_code_bits = cache_bits;
  h->literal = literal;
  HistogramStatsClear(h);
}